

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_invalidate_phys_range_arm(uc_struct_conflict1 *uc,ram_addr_t start,ram_addr_t end)

{
  page_collection *set;
  TargetPageBits *pTVar1;
  PageDesc *pages;
  ulong uVar2;
  PageDesc *start_00;
  tb_page_addr_t in_R8;
  uintptr_t in_R9;
  PageDesc *pPVar3;
  
  set = page_collection_lock_arm(uc,start,end);
  pTVar1 = uc->init_target_page;
  uVar2 = (ulong)pTVar1->mask;
  pPVar3 = (PageDesc *)(uVar2 & start);
  while (end != start && -1 < (long)(end - start)) {
    pPVar3 = (PageDesc *)((long)&pPVar3->first_tb + (long)-(int)uVar2);
    pages = page_find(uc,start >> ((byte)pTVar1->bits & 0x3f));
    if (pages != (PageDesc *)0x0) {
      start_00 = (PageDesc *)end;
      if (pPVar3 < end) {
        start_00 = pPVar3;
      }
      tb_invalidate_phys_page_range__locked
                (uc,(page_collection *)pages,(PageDesc *)start,(tb_page_addr_t)start_00,in_R8,in_R9)
      ;
    }
    pTVar1 = uc->init_target_page;
    uVar2 = (ulong)(uint)pTVar1->mask;
    start = (ram_addr_t)pPVar3;
  }
  page_collection_unlock_arm(set);
  return;
}

Assistant:

void tb_invalidate_phys_range(struct uc_struct *uc, ram_addr_t start, ram_addr_t end)
{
    struct page_collection *pages;
    tb_page_addr_t next;

    assert_memory_lock();

    pages = page_collection_lock(uc, start, end);
    for (next = (start & TARGET_PAGE_MASK) + TARGET_PAGE_SIZE;
         //start < end; Unicorn: Fix possible wrap around
         (intptr_t)(end - start) > 0;
         start = next, next += TARGET_PAGE_SIZE) {
        PageDesc *pd = page_find(uc, start >> TARGET_PAGE_BITS);
        tb_page_addr_t bound = MIN(next, end);

        if (pd == NULL) {
            continue;
        }
        tb_invalidate_phys_page_range__locked(uc, pages, pd, start, bound, 0);
    }
    page_collection_unlock(pages);
}